

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_greedy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ZSTD_compressionParameters *cParams;
  int *iEnd;
  BYTE *iStart;
  int *piVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  BYTE *pBVar5;
  BYTE *pBVar6;
  U32 *pUVar7;
  undefined8 uVar8;
  uint uVar9;
  uint uVar10;
  U32 UVar11;
  int *ilimit_w;
  size_t sVar12;
  BYTE *pBVar13;
  uint uVar14;
  BYTE *pBVar15;
  int *piVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  int *ip;
  ulong uVar23;
  int iVar24;
  seqDef *psVar25;
  bool bVar26;
  uint local_104;
  uint local_f8;
  int local_90;
  
  iEnd = (int *)((long)src + srcSize);
  piVar1 = (int *)((long)src + (srcSize - 8));
  pBVar5 = (ms->window).base;
  pBVar6 = (ms->window).dictBase;
  uVar3 = (ms->window).dictLimit;
  uVar4 = (ms->window).lowLimit;
  iStart = pBVar5 + uVar3;
  ip = (int *)((ulong)(iStart == (BYTE *)src) + (long)src);
  ilimit_w = (int *)((long)src + (srcSize - 0x20));
  local_f8 = *rep;
  local_104 = rep[1];
  cParams = &ms->cParams;
LAB_00124012:
  do {
    if (piVar1 <= ip) {
      *rep = local_f8;
      rep[1] = local_104;
      return (long)iEnd - (long)src;
    }
    iVar24 = (int)ip;
    local_90 = (int)pBVar5;
    uVar9 = ((iVar24 - local_90) - local_f8) + 1;
    if (uVar4 < uVar9 && 2 < (uVar3 - 1) - uVar9) {
      pBVar13 = pBVar5;
      if (uVar9 < uVar3) {
        pBVar13 = pBVar6;
      }
      if (*(int *)((long)ip + 1) != *(int *)(pBVar13 + uVar9)) goto LAB_0012406b;
      piVar16 = iEnd;
      if (uVar9 < uVar3) {
        piVar16 = (int *)(pBVar6 + uVar3);
      }
      sVar12 = ZSTD_count_2segments
                         ((BYTE *)((long)ip + 5),pBVar13 + (ulong)uVar9 + 4,(BYTE *)iEnd,
                          (BYTE *)piVar16,iStart);
      uVar23 = sVar12 + 4;
      ip = (int *)((long)ip + 1);
LAB_00124620:
      UVar11 = 1;
    }
    else {
LAB_0012406b:
      uVar9 = (ms->cParams).minMatch;
      if (uVar9 - 6 < 2) {
        uVar10 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar7 = ms->chainTable;
        pBVar13 = (ms->window).base;
        pBVar15 = (ms->window).dictBase;
        uVar9 = (ms->window).dictLimit;
        uVar19 = iVar24 - (int)pBVar13;
        uVar17 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar14 = (ms->window).lowLimit;
        uVar21 = uVar19 - uVar17;
        if (uVar19 - uVar14 <= uVar17) {
          uVar21 = uVar14;
        }
        if (ms->loadedDictEnd != 0) {
          uVar21 = uVar14;
        }
        uVar14 = uVar19 - uVar10;
        if (uVar19 < uVar10) {
          uVar14 = 0;
        }
        iVar24 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        UVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,6);
        uVar20 = 999999999;
        uVar23 = 3;
        while( true ) {
          bVar26 = iVar24 == 0;
          iVar24 = iVar24 + -1;
          if ((UVar11 <= uVar21) || (bVar26)) break;
          if (UVar11 < uVar9) {
            if (pBVar15 + uVar9 < pBVar15 + (ulong)UVar11 + 4) {
LAB_0012493f:
              __assert_fail("match+4 <= dictEnd",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x40dd,
                            "size_t ZSTD_HcFindBestMatch_generic(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                           );
            }
            if (*(int *)(pBVar15 + UVar11) == *ip) {
              sVar12 = ZSTD_count_2segments
                                 ((BYTE *)(ip + 1),pBVar15 + (ulong)UVar11 + 4,(BYTE *)iEnd,
                                  pBVar15 + uVar9,pBVar13 + uVar9);
              sVar12 = sVar12 + 4;
LAB_001241d0:
              if ((uVar23 < sVar12) &&
                 (uVar20 = (ulong)((uVar19 + 2) - UVar11), uVar23 = sVar12,
                 (int *)((long)ip + sVar12) == iEnd)) break;
            }
          }
          else if ((pBVar13 + UVar11)[uVar23] == *(BYTE *)((long)ip + uVar23)) {
            sVar12 = ZSTD_count((BYTE *)ip,pBVar13 + UVar11,(BYTE *)iEnd);
            goto LAB_001241d0;
          }
          if (UVar11 <= uVar14) break;
          UVar11 = pUVar7[UVar11 & uVar10 - 1];
        }
      }
      else if (uVar9 == 5) {
        uVar10 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar7 = ms->chainTable;
        pBVar13 = (ms->window).base;
        pBVar15 = (ms->window).dictBase;
        uVar9 = (ms->window).dictLimit;
        uVar19 = iVar24 - (int)pBVar13;
        uVar17 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar14 = (ms->window).lowLimit;
        uVar21 = uVar19 - uVar17;
        if (uVar19 - uVar14 <= uVar17) {
          uVar21 = uVar14;
        }
        if (ms->loadedDictEnd != 0) {
          uVar21 = uVar14;
        }
        uVar14 = uVar19 - uVar10;
        if (uVar19 < uVar10) {
          uVar14 = 0;
        }
        iVar24 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        UVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,5);
        uVar20 = 999999999;
        uVar23 = 3;
        while( true ) {
          bVar26 = iVar24 == 0;
          iVar24 = iVar24 + -1;
          if ((UVar11 <= uVar21) || (bVar26)) break;
          if (UVar11 < uVar9) {
            if (pBVar15 + uVar9 < pBVar15 + (ulong)UVar11 + 4) goto LAB_0012493f;
            if (*(int *)(pBVar15 + UVar11) == *ip) {
              sVar12 = ZSTD_count_2segments
                                 ((BYTE *)(ip + 1),pBVar15 + (ulong)UVar11 + 4,(BYTE *)iEnd,
                                  pBVar15 + uVar9,pBVar13 + uVar9);
              sVar12 = sVar12 + 4;
LAB_00124367:
              if ((uVar23 < sVar12) &&
                 (uVar20 = (ulong)((uVar19 + 2) - UVar11), uVar23 = sVar12,
                 (int *)((long)ip + sVar12) == iEnd)) break;
            }
          }
          else if ((pBVar13 + UVar11)[uVar23] == *(BYTE *)((long)ip + uVar23)) {
            sVar12 = ZSTD_count((BYTE *)ip,pBVar13 + UVar11,(BYTE *)iEnd);
            goto LAB_00124367;
          }
          if (UVar11 <= uVar14) break;
          UVar11 = pUVar7[UVar11 & uVar10 - 1];
        }
      }
      else {
        uVar10 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar7 = ms->chainTable;
        pBVar13 = (ms->window).base;
        pBVar15 = (ms->window).dictBase;
        uVar9 = (ms->window).dictLimit;
        uVar19 = iVar24 - (int)pBVar13;
        uVar17 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar14 = (ms->window).lowLimit;
        uVar21 = uVar19 - uVar17;
        if (uVar19 - uVar14 <= uVar17) {
          uVar21 = uVar14;
        }
        if (ms->loadedDictEnd != 0) {
          uVar21 = uVar14;
        }
        uVar14 = uVar19 - uVar10;
        if (uVar19 < uVar10) {
          uVar14 = 0;
        }
        iVar24 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        UVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,4);
        uVar20 = 999999999;
        uVar23 = 3;
        while( true ) {
          bVar26 = iVar24 == 0;
          iVar24 = iVar24 + -1;
          if ((UVar11 <= uVar21) || (bVar26)) break;
          if (UVar11 < uVar9) {
            if (pBVar15 + uVar9 < pBVar15 + (ulong)UVar11 + 4) goto LAB_0012493f;
            if (*(int *)(pBVar15 + UVar11) == *ip) {
              sVar12 = ZSTD_count_2segments
                                 ((BYTE *)(ip + 1),pBVar15 + (ulong)UVar11 + 4,(BYTE *)iEnd,
                                  pBVar15 + uVar9,pBVar13 + uVar9);
              sVar12 = sVar12 + 4;
LAB_001244f5:
              if ((uVar23 < sVar12) &&
                 (uVar20 = (ulong)((uVar19 + 2) - UVar11), uVar23 = sVar12,
                 (int *)((long)ip + sVar12) == iEnd)) break;
            }
          }
          else if ((pBVar13 + UVar11)[uVar23] == *(BYTE *)((long)ip + uVar23)) {
            sVar12 = ZSTD_count((BYTE *)ip,pBVar13 + UVar11,(BYTE *)iEnd);
            goto LAB_001244f5;
          }
          if (UVar11 <= uVar14) break;
          UVar11 = pUVar7[UVar11 & uVar10 - 1];
        }
      }
      if (uVar23 < 4) {
        ip = (int *)((long)ip + ((long)ip - (long)src >> 8) + 1);
        goto LAB_00124012;
      }
      if (uVar20 == 0) goto LAB_00124620;
      uVar18 = (long)ip + (2 - (long)(pBVar5 + uVar20));
      pBVar15 = iStart;
      pBVar13 = pBVar5;
      if ((uint)uVar18 < uVar3) {
        pBVar15 = pBVar6 + uVar4;
        pBVar13 = pBVar6;
      }
      pBVar13 = pBVar13 + (uVar18 & 0xffffffff);
      for (; ((src < ip && (pBVar15 < pBVar13)) && (*(BYTE *)((long)ip + -1) == pBVar13[-1]));
          ip = (int *)((long)ip + -1)) {
        pBVar13 = pBVar13 + -1;
        uVar23 = uVar23 + 1;
      }
      local_104 = local_f8;
      local_f8 = (int)uVar20 - 2;
      UVar11 = (int)uVar20 + 1;
    }
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_0012495e:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2038,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < seqStore->maxNbLit) {
LAB_0012497d:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203a,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar20 = (long)ip - (long)src;
    pBVar13 = seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < pBVar13 + uVar20) {
LAB_0012499c:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (iEnd < ip) {
LAB_001249bb:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203c,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (ilimit_w < ip) {
      ZSTD_safecopyLiterals(pBVar13,(BYTE *)src,(BYTE *)ip,(BYTE *)ilimit_w);
LAB_0012468d:
      seqStore->lit = seqStore->lit + uVar20;
      if (0xffff < uVar20) {
        if (seqStore->longLengthID != 0) {
          __assert_fail("seqStorePtr->longLengthID == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x204d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthID = 1;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      uVar8 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar13 = *src;
      *(undefined8 *)(pBVar13 + 8) = uVar8;
      pBVar13 = seqStore->lit;
      if (0x10 < uVar20) {
        lVar22 = (long)(pBVar13 + 0x10) - ((long)src + 0x10);
        if (lVar22 < 8) {
          if (-0x10 < lVar22) {
            __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x1268,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
        }
        else if (0xffffffffffffffe0 < lVar22 - 0x10U) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x1270,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar8 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar13 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar13 + 0x18) = uVar8;
        if (0x20 < (long)uVar20) {
          lVar22 = 0;
          do {
            puVar2 = (undefined8 *)((long)src + lVar22 + 0x20);
            uVar8 = puVar2[1];
            pBVar15 = pBVar13 + lVar22 + 0x20;
            *(undefined8 *)pBVar15 = *puVar2;
            *(undefined8 *)(pBVar15 + 8) = uVar8;
            puVar2 = (undefined8 *)((long)src + lVar22 + 0x30);
            uVar8 = puVar2[1];
            *(undefined8 *)(pBVar15 + 0x10) = *puVar2;
            *(undefined8 *)(pBVar15 + 0x18) = uVar8;
            lVar22 = lVar22 + 0x20;
          } while (pBVar15 + 0x20 < pBVar13 + uVar20);
        }
        goto LAB_0012468d;
      }
      seqStore->lit = pBVar13 + uVar20;
    }
    psVar25 = seqStore->sequences;
    psVar25->litLength = (U16)uVar20;
    psVar25->offset = UVar11;
    if (0xffff < uVar23 - 3) {
      if (seqStore->longLengthID != 0) {
LAB_001249da:
        __assert_fail("seqStorePtr->longLengthID == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2058,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      seqStore->longLengthID = 2;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar25->matchLength = (U16)(uVar23 - 3);
    psVar25 = psVar25 + 1;
    seqStore->sequences = psVar25;
    uVar9 = local_104;
    for (ip = (int *)((long)ip + uVar23); local_104 = uVar9, src = ip, ip <= piVar1;
        ip = (int *)((long)ip + sVar12 + 4)) {
      uVar9 = (uint)((long)ip - (long)(pBVar5 + local_104));
      pBVar13 = pBVar5;
      if (uVar9 < uVar3) {
        pBVar13 = pBVar6;
      }
      if (((uVar9 <= uVar4) || ((uVar3 - 1) - uVar9 < 3)) ||
         (*ip != *(int *)(pBVar13 + ((long)ip - (long)(pBVar5 + local_104) & 0xffffffff)))) break;
      piVar16 = iEnd;
      if (uVar9 < uVar3) {
        piVar16 = (int *)(pBVar6 + uVar3);
      }
      sVar12 = ZSTD_count_2segments
                         ((BYTE *)(ip + 1),
                          (BYTE *)((long)(pBVar13 +
                                         ((long)ip - (long)(pBVar5 + local_104) & 0xffffffff)) + 4),
                          (BYTE *)iEnd,(BYTE *)piVar16,iStart);
      if (seqStore->maxNbSeq <= (ulong)((long)psVar25 - (long)seqStore->sequencesStart >> 3))
      goto LAB_0012495e;
      if (0x20000 < seqStore->maxNbLit) goto LAB_0012497d;
      pBVar13 = seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < pBVar13) goto LAB_0012499c;
      if (iEnd < ip) goto LAB_001249bb;
      if (ilimit_w < ip) {
        ZSTD_safecopyLiterals(pBVar13,(BYTE *)ip,(BYTE *)ip,(BYTE *)ilimit_w);
      }
      else {
        uVar8 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar13 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar13 + 8) = uVar8;
      }
      psVar25 = seqStore->sequences;
      psVar25->litLength = 0;
      psVar25->offset = 1;
      if (0xffff < sVar12 + 1) {
        if (seqStore->longLengthID != 0) goto LAB_001249da;
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar25->matchLength = (U16)(sVar12 + 1);
      psVar25 = psVar25 + 1;
      seqStore->sequences = psVar25;
      uVar9 = local_f8;
      local_f8 = local_104;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_greedy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 0);
}